

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  uint64_t *puVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  uint64_t uVar218;
  uint64_t uVar219;
  uint64_t uVar220;
  uint64_t uVar221;
  int iVar222;
  int iVar223;
  uint uVar224;
  ulong uVar225;
  undefined8 extraout_RAX;
  undefined1 *puVar226;
  byte bVar227;
  secp256k1_gej *in_RCX;
  byte bVar228;
  int extraout_EDX;
  secp256k1_fe *extraout_RDX;
  long extraout_RDX_00;
  secp256k1_fe *a_00;
  ulong uVar229;
  ulong uVar230;
  ulong uVar231;
  secp256k1_ge *a_01;
  uint uVar232;
  secp256k1_fe *psVar233;
  secp256k1_gej *psVar234;
  secp256k1_gej *psVar235;
  secp256k1_gej *psVar236;
  ulong uVar237;
  ulong uVar238;
  ulong uVar239;
  ulong unaff_R12;
  secp256k1_fe *psVar240;
  ulong unaff_R13;
  long lVar241;
  long lVar242;
  undefined1 *puVar243;
  undefined8 unaff_R15;
  uint64_t tmp3;
  uint64_t tmp3_1;
  secp256k1_fe s;
  uint64_t tmp3_2;
  uint64_t tmp2;
  secp256k1_fe l;
  undefined1 auStack_3b8 [128];
  ulong uStack_338;
  ulong uStack_330;
  ulong uStack_328;
  long lStack_320;
  undefined8 uStack_318;
  secp256k1_gej *psStack_310;
  ulong uStack_308;
  ulong uStack_300;
  secp256k1_gej *psStack_2f8;
  undefined8 uStack_2f0;
  secp256k1_gej *psStack_2e8;
  secp256k1_fe *psStack_2d8;
  secp256k1_gej sStack_2d0;
  secp256k1_gej sStack_238;
  secp256k1_ge sStack_1a0;
  secp256k1_gej *psStack_138;
  ulong uStack_130;
  ulong uStack_128;
  secp256k1_gej *psStack_120;
  undefined8 uStack_118;
  secp256k1_gej *psStack_110;
  code *pcStack_108;
  code *pcStack_100;
  secp256k1_fe *local_f0;
  secp256k1_gej *local_e8;
  secp256k1_fe *local_e0;
  undefined1 local_d8 [120];
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  secp256k1_gej *local_40;
  int local_38;
  
  pcStack_100 = (code *)0x14b2e5;
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  psVar233 = &a->z;
  psVar234 = (secp256k1_gej *)&a->y;
  pcStack_100 = (code *)0x14b306;
  secp256k1_fe_mul(&r->z,psVar233,(secp256k1_fe *)psVar234);
  pcStack_100 = (code *)0x14b30e;
  psVar235 = psVar234;
  secp256k1_fe_verify((secp256k1_fe *)psVar234);
  if ((a->y).magnitude < 9) {
    uVar231 = ((secp256k1_fe *)psVar234)->n[0];
    uVar237 = (a->y).n[1];
    unaff_R12 = (a->y).n[2];
    unaff_R13 = (a->y).n[3];
    uVar230 = (a->y).n[4];
    unaff_R15 = 0xfffffffffffff;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar231 * 2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = unaff_R13;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar237 * 2;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = unaff_R12;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar230;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar230;
    uVar225 = SUB168(auVar5 * auVar105,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar225 & 0xfffffffffffff;
    auVar3 = auVar4 * auVar104 + auVar3 * auVar103 + auVar6 * ZEXT816(0x1000003d10);
    uVar229 = auVar3._0_8_;
    local_60 = uVar229 & 0xfffffffffffff;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar229 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar236 = (secp256k1_gej *)(uVar230 * 2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar231;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = psVar236;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar237 * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = unaff_R13;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = unaff_R12;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = unaff_R12;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar225 >> 0x34 | SUB168(auVar5 * auVar105,8) << 0xc;
    auVar3 = auVar7 * auVar106 + auVar183 + auVar8 * auVar107 + auVar9 * auVar108 +
             auVar10 * ZEXT816(0x1000003d10);
    uVar230 = auVar3._0_8_;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    local_f0 = (secp256k1_fe *)((uVar230 & 0xfffffffffffff) >> 0x30);
    psVar233 = (secp256k1_fe *)(uVar230 & 0xffffffffffff);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar231;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar231;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar237;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = psVar236;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = unaff_R12 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = unaff_R13;
    auVar3 = auVar12 * auVar110 + auVar184 + auVar13 * auVar111;
    uVar230 = auVar3._0_8_;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = (uVar230 & 0xfffffffffffff) << 4 | (ulong)local_f0;
    auVar3 = auVar11 * auVar109 + ZEXT816(0x1000003d1) * auVar112;
    uVar230 = auVar3._0_8_;
    local_d8._0_8_ = uVar230 & 0xfffffffffffff;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar231 * 2;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar237;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_R12;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = psVar236;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = unaff_R13;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = unaff_R13;
    auVar4 = auVar15 * auVar114 + auVar186 + auVar16 * auVar115;
    uVar230 = auVar4._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar230 & 0xfffffffffffff;
    auVar3 = auVar14 * auVar113 + auVar185 + auVar17 * ZEXT816(0x1000003d10);
    uVar225 = auVar3._0_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar230 >> 0x34 | auVar4._8_8_ << 0xc;
    local_d8._8_8_ = uVar225 & 0xfffffffffffff;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar225 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar231 * 2;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = unaff_R12;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar237;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar237;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = unaff_R13;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = psVar236;
    auVar188 = auVar20 * auVar118 + auVar188;
    uVar231 = auVar188._0_8_;
    in_RCX = auVar188._8_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar231 & 0xfffffffffffff;
    auVar3 = auVar18 * auVar116 + auVar187 + auVar19 * auVar117 + auVar21 * ZEXT816(0x1000003d10);
    uVar237 = auVar3._0_8_;
    local_d8._16_8_ = uVar237 & 0xfffffffffffff;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = (uVar237 >> 0x34 | auVar3._8_8_ << 0xc) + local_60;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar231 >> 0x34 | (long)in_RCX << 0xc;
    auVar189 = auVar22 * ZEXT816(0x1000003d10) + auVar189;
    uVar231 = auVar189._0_8_;
    local_d8._24_8_ = uVar231 & 0xfffffffffffff;
    local_d8._32_8_ = (long)psVar233->n + (uVar231 >> 0x34 | auVar189._8_8_ << 0xc);
    local_d8._40_4_ = 1;
    local_d8._44_4_ = 0;
    pcStack_100 = (code *)0x14b563;
    local_e8 = a;
    local_d8._64_8_ = psVar233;
    secp256k1_fe_verify((secp256k1_fe *)local_d8);
    pcStack_100 = (code *)0x14b56b;
    psVar235 = a;
    secp256k1_fe_verify(&a->x);
    psVar234 = a;
    if (8 < (a->x).magnitude) goto LAB_0014bf5b;
    psVar234 = (secp256k1_gej *)&stack0xffffffffffffffa0;
    uVar231 = (a->x).n[0];
    uVar237 = (a->x).n[1];
    unaff_R12 = (a->x).n[2];
    unaff_R13 = (a->x).n[3];
    uVar230 = (a->x).n[4];
    unaff_R15 = 0xfffffffffffff;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar231 * 2;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = unaff_R13;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar237 * 2;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = unaff_R12;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar230;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar230;
    uVar225 = SUB168(auVar25 * auVar121,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar225 & 0xfffffffffffff;
    auVar3 = auVar24 * auVar120 + auVar23 * auVar119 + auVar26 * ZEXT816(0x1000003d10);
    uVar229 = auVar3._0_8_;
    local_d8._64_8_ = uVar229 & 0xfffffffffffff;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar229 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar236 = (secp256k1_gej *)(uVar230 * 2);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar231;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = psVar236;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar237 * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = unaff_R13;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = unaff_R12;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = unaff_R12;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar225 >> 0x34 | SUB168(auVar25 * auVar121,8) << 0xc;
    auVar3 = auVar27 * auVar122 + auVar190 + auVar28 * auVar123 + auVar29 * auVar124 +
             auVar30 * ZEXT816(0x1000003d10);
    uVar230 = auVar3._0_8_;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    local_e0 = (secp256k1_fe *)((uVar230 & 0xfffffffffffff) >> 0x30);
    psVar233 = (secp256k1_fe *)(uVar230 & 0xffffffffffff);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar231;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar231;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar237;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = psVar236;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = unaff_R12 * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = unaff_R13;
    auVar3 = auVar32 * auVar126 + auVar191 + auVar33 * auVar127;
    uVar230 = auVar3._0_8_;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = (uVar230 & 0xfffffffffffff) << 4 | (ulong)local_e0;
    auVar3 = auVar31 * auVar125 + ZEXT816(0x1000003d1) * auVar128;
    uVar230 = auVar3._0_8_;
    local_60 = uVar230 & 0xfffffffffffff;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar231 * 2;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar237;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = unaff_R12;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = psVar236;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = unaff_R13;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = unaff_R13;
    auVar4 = auVar35 * auVar130 + auVar193 + auVar36 * auVar131;
    uVar230 = auVar4._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar230 & 0xfffffffffffff;
    auVar3 = auVar34 * auVar129 + auVar192 + auVar37 * ZEXT816(0x1000003d10);
    uVar225 = auVar3._0_8_;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar230 >> 0x34 | auVar4._8_8_ << 0xc;
    local_58 = uVar225 & 0xfffffffffffff;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar225 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar231 * 2;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = unaff_R12;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar237;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar237;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = unaff_R13;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = psVar236;
    auVar195 = auVar40 * auVar134 + auVar195;
    uVar231 = auVar195._0_8_;
    in_RCX = auVar195._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar231 & 0xfffffffffffff;
    auVar3 = auVar38 * auVar132 + auVar194 + auVar39 * auVar133 + auVar41 * ZEXT816(0x1000003d10);
    uVar237 = auVar3._0_8_;
    local_50 = uVar237 & 0xfffffffffffff;
    auVar196._8_8_ = 0;
    auVar196._0_8_ =
         (long)((secp256k1_fe *)local_d8._64_8_)->n + (uVar237 >> 0x34 | auVar3._8_8_ << 0xc);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar231 >> 0x34 | (long)in_RCX << 0xc;
    auVar196 = auVar42 * ZEXT816(0x1000003d10) + auVar196;
    uVar231 = auVar196._0_8_;
    local_48 = uVar231 & 0xfffffffffffff;
    local_40 = (secp256k1_gej *)((long)psVar233->n + (uVar231 >> 0x34 | auVar196._8_8_ << 0xc));
    _local_38 = 1;
    pcStack_100 = (code *)0x14b7b5;
    local_f0 = psVar233;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    pcStack_100 = (code *)0x14b7bd;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    if (10 < local_38) goto LAB_0014bf60;
    local_60 = local_60 * 3;
    local_58 = local_58 * 3;
    local_50 = local_50 * 3;
    local_48 = local_48 * 3;
    in_RCX = (secp256k1_gej *)((long)local_40 * 3);
    _local_38 = (ulong)(uint)(local_38 * 3);
    pcStack_100 = (code *)0x14b820;
    local_40 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa0);
    pcStack_100 = (code *)0x14b828;
    secp256k1_fe_half((secp256k1_fe *)&stack0xffffffffffffffa0);
    psVar234 = (secp256k1_gej *)local_d8;
    pcStack_100 = (code *)0x14b835;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    if (1 < (int)local_d8._40_4_) goto LAB_0014bf65;
    local_d8._64_8_ = 0x3ffffbfffff0bc - local_d8._0_8_;
    local_d8._72_8_ = 0x3ffffffffffffc - local_d8._8_8_;
    psVar233 = (secp256k1_fe *)(local_d8 + 0x40);
    local_d8._80_8_ = 0x3ffffffffffffc - local_d8._16_8_;
    local_d8._88_8_ = 0x3ffffffffffffc - local_d8._24_8_;
    local_d8._96_8_ = 0x3fffffffffffc - local_d8._32_8_;
    local_d8._104_8_ = 2;
    pcStack_100 = (code *)0x14b88c;
    secp256k1_fe_verify(psVar233);
    pcStack_100 = (code *)0x14b89c;
    secp256k1_fe_mul(psVar233,psVar233,&local_e8->x);
    psVar234 = (secp256k1_gej *)&stack0xffffffffffffffa0;
    pcStack_100 = (code *)0x14b8ac;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    uVar237 = local_48;
    uVar231 = local_50;
    if (8 < local_38) goto LAB_0014bf6a;
    unaff_R15 = 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_60 * 2;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_48;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_58 * 2;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_50;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_40;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_40;
    uVar230 = SUB168(auVar45 * auVar137,0);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar230 & 0xfffffffffffff;
    auVar3 = auVar44 * auVar136 + auVar43 * auVar135 + auVar46 * ZEXT816(0x1000003d10);
    uVar225 = auVar3._0_8_;
    local_f0 = (secp256k1_fe *)(uVar225 & 0xfffffffffffff);
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar225 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar236 = (secp256k1_gej *)((long)local_40 * 2);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_60;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = psVar236;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_58 * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_48;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_50;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = local_50;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar230 >> 0x34 | SUB168(auVar45 * auVar137,8) << 0xc;
    auVar3 = auVar47 * auVar138 + auVar197 + auVar48 * auVar139 + auVar49 * auVar140 +
             auVar50 * ZEXT816(0x1000003d10);
    uVar230 = auVar3._0_8_;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    local_d8._56_8_ = (uVar230 & 0xfffffffffffff) >> 0x30;
    psVar233 = (secp256k1_fe *)(uVar230 & 0xffffffffffff);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_60;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = local_60;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_58;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = psVar236;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_50 * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_48;
    auVar3 = auVar52 * auVar142 + auVar198 + auVar53 * auVar143;
    uVar230 = auVar3._0_8_;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = (uVar230 & 0xfffffffffffff) << 4 | local_d8._56_8_;
    auVar3 = auVar51 * auVar141 + ZEXT816(0x1000003d1) * auVar144;
    uVar230 = auVar3._0_8_;
    (r->x).n[0] = uVar230 & 0xfffffffffffff;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_60 * 2;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = local_58;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_50;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = psVar236;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_48;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = local_48;
    auVar4 = auVar55 * auVar146 + auVar200 + auVar56 * auVar147;
    uVar230 = auVar4._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar230 & 0xfffffffffffff;
    auVar3 = auVar54 * auVar145 + auVar199 + auVar57 * ZEXT816(0x1000003d10);
    uVar225 = auVar3._0_8_;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar230 >> 0x34 | auVar4._8_8_ << 0xc;
    (r->x).n[1] = uVar225 & 0xfffffffffffff;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar225 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_60 * 2;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = local_50;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_58;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = local_58;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_48;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = psVar236;
    auVar202 = auVar60 * auVar150 + auVar202;
    uVar230 = auVar202._0_8_;
    in_RCX = auVar202._8_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar230 & 0xfffffffffffff;
    auVar3 = auVar58 * auVar148 + auVar201 + auVar59 * auVar149 + auVar61 * ZEXT816(0x1000003d10);
    uVar225 = auVar3._0_8_;
    (r->x).n[2] = uVar225 & 0xfffffffffffff;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = (long)local_f0->n + (uVar225 >> 0x34 | auVar3._8_8_ << 0xc);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar230 >> 0x34 | (long)in_RCX << 0xc;
    auVar203 = auVar62 * ZEXT816(0x1000003d10) + auVar203;
    uVar230 = auVar203._0_8_;
    (r->x).n[3] = uVar230 & 0xfffffffffffff;
    (r->x).n[4] = (long)psVar233->n + (uVar230 >> 0x34 | auVar203._8_8_ << 0xc);
    (r->x).magnitude = 1;
    (r->x).normalized = 0;
    pcStack_100 = (code *)0x14baee;
    local_e0 = psVar233;
    secp256k1_fe_verify(&r->x);
    pcStack_100 = (code *)0x14baf6;
    secp256k1_fe_verify(&r->x);
    psVar234 = (secp256k1_gej *)(local_d8 + 0x40);
    pcStack_100 = (code *)0x14bb03;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    iVar223 = local_d8._104_4_ + (r->x).magnitude;
    if (0x20 < iVar223) goto LAB_0014bf6f;
    uVar218 = (r->x).n[1];
    uVar219 = (r->x).n[2];
    uVar220 = (r->x).n[3];
    psVar234 = (secp256k1_gej *)(local_d8 + 0x40);
    (r->x).n[0] = (long)(uint64_t *)local_d8._64_8_ + (r->x).n[0];
    (r->x).n[1] = uVar218 + local_d8._72_8_;
    (r->x).n[2] = uVar219 + local_d8._80_8_;
    (r->x).n[3] = uVar220 + local_d8._88_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = (long)((secp256k1_fe *)local_d8._96_8_)->n + *puVar1;
    (r->x).magnitude = iVar223;
    (r->x).normalized = 0;
    pcStack_100 = (code *)0x14bb4e;
    in_RCX = (secp256k1_gej *)local_d8._96_8_;
    secp256k1_fe_verify(&r->x);
    pcStack_100 = (code *)0x14bb56;
    secp256k1_fe_verify(&r->x);
    pcStack_100 = (code *)0x14bb5e;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    iVar223 = local_d8._104_4_ + (r->x).magnitude;
    if (0x20 < iVar223) goto LAB_0014bf74;
    uVar218 = (r->x).n[1];
    uVar219 = (r->x).n[2];
    uVar220 = (r->x).n[3];
    (r->x).n[0] = (long)(uint64_t *)local_d8._64_8_ + (r->x).n[0];
    (r->x).n[1] = uVar218 + local_d8._72_8_;
    (r->x).n[2] = uVar219 + local_d8._80_8_;
    (r->x).n[3] = uVar220 + local_d8._88_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = (long)((secp256k1_fe *)local_d8._96_8_)->n + *puVar1;
    (r->x).magnitude = iVar223;
    (r->x).normalized = 0;
    pcStack_100 = (code *)0x14bbab;
    in_RCX = (secp256k1_gej *)local_d8._96_8_;
    secp256k1_fe_verify(&r->x);
    psVar234 = (secp256k1_gej *)local_d8;
    pcStack_100 = (code *)0x14bbb8;
    psVar235 = psVar234;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    uVar225 = local_d8._24_8_;
    uVar230 = local_d8._16_8_;
    if (8 < (int)local_d8._40_4_) goto LAB_0014bf79;
    unaff_R15 = 0xfffffffffffff;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_d8._0_8_ * 2;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_d8._24_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_d8._8_8_ * 2;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = local_d8._16_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_d8._32_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_d8._32_8_;
    uVar231 = SUB168(auVar65 * auVar153,0);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar231 & 0xfffffffffffff;
    auVar3 = auVar64 * auVar152 + auVar63 * auVar151 + auVar66 * ZEXT816(0x1000003d10);
    uVar237 = auVar3._0_8_;
    local_f0 = (secp256k1_fe *)(uVar237 & 0xfffffffffffff);
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar237 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar236 = (secp256k1_gej *)(local_d8._32_8_ * 2);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_d8._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = psVar236;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_d8._8_8_ * 2;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_d8._24_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_d8._16_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = local_d8._16_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar231 >> 0x34 | SUB168(auVar65 * auVar153,8) << 0xc;
    auVar3 = auVar67 * auVar154 + auVar204 + auVar68 * auVar155 + auVar69 * auVar156 +
             auVar70 * ZEXT816(0x1000003d10);
    uVar231 = auVar3._0_8_;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar231 >> 0x34 | auVar3._8_8_ << 0xc;
    local_d8._56_8_ = (uVar231 & 0xfffffffffffff) >> 0x30;
    psVar233 = (secp256k1_fe *)(uVar231 & 0xffffffffffff);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_d8._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_d8._0_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_d8._8_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = psVar236;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_d8._16_8_ * 2;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_d8._24_8_;
    auVar3 = auVar72 * auVar158 + auVar205 + auVar73 * auVar159;
    uVar231 = auVar3._0_8_;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar231 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (uVar231 & 0xfffffffffffff) << 4 | local_d8._56_8_;
    auVar3 = auVar71 * auVar157 + ZEXT816(0x1000003d1) * auVar160;
    uVar237 = auVar3._0_8_;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar237 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_d8._0_8_ * 2;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_d8._8_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_d8._16_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = psVar236;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_d8._24_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_d8._24_8_;
    auVar4 = auVar75 * auVar162 + auVar207 + auVar76 * auVar163;
    uVar231 = auVar4._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar231 & 0xfffffffffffff;
    auVar3 = auVar74 * auVar161 + auVar206 + auVar77 * ZEXT816(0x1000003d10);
    uVar229 = auVar3._0_8_;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar231 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar229 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_d8._0_8_ * 2;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = local_d8._16_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_d8._8_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_d8._8_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_d8._24_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = psVar236;
    auVar209 = auVar80 * auVar166 + auVar209;
    uVar231 = auVar209._0_8_;
    in_RCX = auVar209._8_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar231 & 0xfffffffffffff;
    auVar3 = auVar78 * auVar164 + auVar208 + auVar79 * auVar165 + auVar81 * ZEXT816(0x1000003d10);
    uVar238 = auVar3._0_8_;
    local_d8._16_8_ = uVar238 & 0xfffffffffffff;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = (long)local_f0->n + (uVar238 >> 0x34 | auVar3._8_8_ << 0xc);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar231 >> 0x34 | (long)in_RCX << 0xc;
    auVar210 = auVar82 * ZEXT816(0x1000003d10) + auVar210;
    uVar231 = auVar210._0_8_;
    local_d8._24_8_ = uVar231 & 0xfffffffffffff;
    local_d8._32_8_ = (long)psVar233->n + (uVar231 >> 0x34 | auVar210._8_8_ << 0xc);
    local_d8._40_4_ = 1;
    local_d8._44_4_ = 0;
    pcStack_100 = (code *)0x14be00;
    local_e0 = psVar233;
    local_d8._0_8_ = uVar237 & 0xfffffffffffff;
    local_d8._8_8_ = uVar229 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)local_d8);
    psVar234 = (secp256k1_gej *)(local_d8 + 0x40);
    pcStack_100 = (code *)0x14be0d;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    pcStack_100 = (code *)0x14be15;
    psVar235 = r;
    secp256k1_fe_verify(&r->x);
    uVar224 = (r->x).magnitude + local_d8._104_4_;
    if (0x20 < (int)uVar224) goto LAB_0014bf7e;
    psVar233 = (secp256k1_fe *)(local_d8 + 0x40);
    local_d8._64_8_ = (long)(uint64_t *)local_d8._64_8_ + (r->x).n[0];
    local_d8._72_8_ = (r->x).n[1] + local_d8._72_8_;
    local_d8._80_8_ = (r->x).n[2] + local_d8._80_8_;
    local_d8._88_8_ = (r->x).n[3] + local_d8._88_8_;
    in_RCX = (secp256k1_gej *)(r->x).n[4];
    local_d8._96_8_ = (long)((secp256k1_fe *)local_d8._96_8_)->n + (long)(in_RCX->x).n;
    local_d8._108_4_ = 0;
    local_d8._104_4_ = uVar224;
    pcStack_100 = (code *)0x14be65;
    secp256k1_fe_verify(psVar233);
    psVar234 = (secp256k1_gej *)&r->y;
    pcStack_100 = (code *)0x14be7c;
    secp256k1_fe_mul((secp256k1_fe *)psVar234,psVar233,(secp256k1_fe *)&stack0xffffffffffffffa0);
    pcStack_100 = (code *)0x14be84;
    secp256k1_fe_verify((secp256k1_fe *)psVar234);
    psVar236 = (secp256k1_gej *)local_d8;
    pcStack_100 = (code *)0x14be91;
    psVar235 = psVar236;
    secp256k1_fe_verify((secp256k1_fe *)psVar236);
    iVar223 = local_d8._40_4_ + (r->y).magnitude;
    if (iVar223 < 0x21) {
      uVar218 = (r->y).n[1];
      uVar219 = (r->y).n[2];
      uVar220 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_d8._0_8_;
      (r->y).n[1] = uVar218 + local_d8._8_8_;
      (r->y).n[2] = uVar219 + local_d8._16_8_;
      (r->y).n[3] = uVar220 + local_d8._24_8_;
      puVar1 = (r->y).n + 4;
      *puVar1 = (long)((secp256k1_fe *)local_d8._32_8_)->n + *puVar1;
      (r->y).magnitude = iVar223;
      (r->y).normalized = 0;
      pcStack_100 = (code *)0x14bedc;
      in_RCX = (secp256k1_gej *)local_d8._32_8_;
      secp256k1_fe_verify((secp256k1_fe *)psVar234);
      pcStack_100 = (code *)0x14bee4;
      psVar235 = psVar234;
      secp256k1_fe_verify((secp256k1_fe *)psVar234);
      if ((r->y).magnitude < 3) {
        uVar218 = (r->y).n[1];
        uVar219 = (r->y).n[2];
        uVar220 = (r->y).n[3];
        (r->y).n[0] = 0x5ffff9ffffe91a - (r->y).n[0];
        (r->y).n[1] = 0x5ffffffffffffa - uVar218;
        (r->y).n[2] = 0x5ffffffffffffa - uVar219;
        (r->y).n[3] = 0x5ffffffffffffa - uVar220;
        (r->y).n[4] = 0x5fffffffffffa - (r->y).n[4];
        (r->y).magnitude = 3;
        (r->y).normalized = 0;
        pcStack_100 = (code *)0x14bf3c;
        secp256k1_fe_verify((secp256k1_fe *)psVar234);
        pcStack_100 = (code *)0x14bf44;
        secp256k1_gej_verify(r);
        return;
      }
      goto LAB_0014bf88;
    }
  }
  else {
    pcStack_100 = (code *)0x14bf5b;
    secp256k1_gej_double_cold_11();
    psVar236 = a;
LAB_0014bf5b:
    pcStack_100 = (code *)0x14bf60;
    secp256k1_gej_double_cold_10();
LAB_0014bf60:
    pcStack_100 = (code *)0x14bf65;
    secp256k1_gej_double_cold_9();
LAB_0014bf65:
    pcStack_100 = (code *)0x14bf6a;
    secp256k1_gej_double_cold_8();
LAB_0014bf6a:
    uVar237 = unaff_R13;
    uVar231 = unaff_R12;
    pcStack_100 = (code *)0x14bf6f;
    secp256k1_gej_double_cold_7();
LAB_0014bf6f:
    pcStack_100 = (code *)0x14bf74;
    secp256k1_gej_double_cold_6();
LAB_0014bf74:
    pcStack_100 = (code *)0x14bf79;
    secp256k1_gej_double_cold_5();
LAB_0014bf79:
    uVar225 = uVar237;
    uVar230 = uVar231;
    pcStack_100 = (code *)0x14bf7e;
    secp256k1_gej_double_cold_4();
LAB_0014bf7e:
    pcStack_100 = (code *)0x14bf83;
    secp256k1_gej_double_cold_3();
  }
  pcStack_100 = (code *)0x14bf88;
  secp256k1_gej_double_cold_2();
LAB_0014bf88:
  pcStack_100 = secp256k1_scalar_cadd_bit;
  secp256k1_gej_double_cold_1();
  if ((uint)psVar233 < 0x100) {
    in_RCX = (secp256k1_gej *)((ulong)psVar233 & 0xffffffff);
    uVar232 = extraout_EDX - 1U & 0x100 | (uint)psVar233;
    uVar224 = uVar232 >> 6;
    bVar227 = (byte)in_RCX;
    uVar237 = (ulong)(uVar232 < 0x40) << (bVar227 & 0x3f);
    psVar233 = (secp256k1_fe *)((ulong)(uVar224 == 1) << (bVar227 & 0x3f));
    uVar238 = (ulong)(uVar224 == 2) << (bVar227 & 0x3f);
    uVar239 = (ulong)(uVar224 == 3) << (bVar227 & 0x3f);
    uVar231 = (psVar235->x).n[0];
    (psVar235->x).n[0] = (psVar235->x).n[0] + uVar237;
    puVar1 = (psVar235->x).n + 1;
    uVar237 = (ulong)CARRY8(uVar231,uVar237);
    uVar231 = *puVar1;
    uVar229 = (long)psVar233->n + *puVar1;
    *puVar1 = uVar229 + uVar237;
    puVar1 = (psVar235->x).n + 2;
    uVar237 = (ulong)(CARRY8(uVar231,(ulong)psVar233) || CARRY8(uVar229,uVar237));
    uVar231 = *puVar1;
    uVar229 = *puVar1 + uVar238;
    *puVar1 = uVar229 + uVar237;
    puVar1 = (psVar235->x).n + 3;
    uVar237 = (ulong)(CARRY8(uVar231,uVar238) || CARRY8(uVar229,uVar237));
    uVar231 = *puVar1;
    uVar229 = *puVar1 + uVar239;
    *puVar1 = uVar229 + uVar237;
    if (!CARRY8(uVar231,uVar239) && !CARRY8(uVar229,uVar237)) {
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x14bff8;
    secp256k1_scalar_cadd_bit_cold_2();
  }
  pcStack_108 = secp256k1_scalar_shr_int;
  secp256k1_scalar_cadd_bit_cold_1();
  pcStack_108 = (code *)extraout_RAX;
  if ((int)psVar233 < 1) {
    psStack_110 = (secp256k1_gej *)0x14c071;
    secp256k1_scalar_shr_int_cold_2();
  }
  else if ((int)psVar233 < 0x10) {
    bVar227 = (byte)psVar233;
    uVar231 = (psVar235->x).n[1];
    bVar228 = -bVar227;
    (psVar235->x).n[0] = (uVar231 << (bVar228 & 0x3f)) + ((psVar235->x).n[0] >> (bVar227 & 0x3f));
    uVar237 = (psVar235->x).n[2];
    (psVar235->x).n[1] = (uVar237 << (bVar228 & 0x3f)) + (uVar231 >> (bVar227 & 0x3f));
    uVar231 = (psVar235->x).n[3];
    (psVar235->x).n[2] = (uVar231 << (bVar228 & 0x3f)) + (uVar237 >> (bVar227 & 0x3f));
    (psVar235->x).n[3] = uVar231 >> (bVar227 & 0x3f);
    return;
  }
  psStack_110 = (secp256k1_gej *)secp256k1_ecmult_odd_multiples_table;
  secp256k1_scalar_shr_int_cold_1();
  psStack_138 = psVar234;
  uStack_130 = uVar230;
  uStack_128 = uVar225;
  psStack_120 = psVar236;
  uStack_118 = unaff_R15;
  psStack_110 = r;
  if (in_RCX->infinity == 0) {
    psStack_2e8 = (secp256k1_gej *)0x14c0b7;
    psStack_2d8 = extraout_RDX;
    secp256k1_gej_double_var(&sStack_238,in_RCX,(secp256k1_fe *)0x0);
    psStack_2e8 = (secp256k1_gej *)0x14c0d2;
    secp256k1_ge_set_xy(&sStack_1a0,&sStack_238.x,&sStack_238.y);
    psStack_2e8 = (secp256k1_gej *)0x14c0e8;
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar235,in_RCX,&sStack_238.z);
    psStack_2e8 = (secp256k1_gej *)0x14c0f8;
    secp256k1_gej_set_ge(&sStack_2d0,(secp256k1_ge *)psVar235);
    sStack_2d0.z.n[0] = (in_RCX->z).n[0];
    sStack_2d0.z.n[1] = (in_RCX->z).n[1];
    sStack_2d0.z.n[2] = (in_RCX->z).n[2];
    sStack_2d0.z.n[3] = (in_RCX->z).n[3];
    sStack_2d0.z.n[4] = (in_RCX->z).n[4];
    sStack_2d0.z.magnitude = (in_RCX->z).magnitude;
    sStack_2d0.z.normalized = (in_RCX->z).normalized;
    psVar233->n[4] = sStack_238.z.n[4];
    psVar233->magnitude = sStack_238.z.magnitude;
    psVar233->normalized = sStack_238.z.normalized;
    psVar233->n[2] = sStack_238.z.n[2];
    psVar233->n[3] = sStack_238.z.n[3];
    psVar233->n[0] = sStack_238.z.n[0];
    psVar233->n[1] = sStack_238.z.n[1];
    lVar241 = 0x30;
    do {
      psVar235 = (secp256k1_gej *)((psVar235->z).n + 1);
      psStack_2e8 = (secp256k1_gej *)0x14c155;
      secp256k1_gej_add_ge_var
                (&sStack_2d0,&sStack_2d0,&sStack_1a0,(secp256k1_fe *)((long)psVar233->n + lVar241));
      psStack_2e8 = (secp256k1_gej *)0x14c163;
      secp256k1_ge_set_xy((secp256k1_ge *)psVar235,&sStack_2d0.x,&sStack_2d0.y);
      lVar241 = lVar241 + 0x30;
    } while (lVar241 != 0x180);
    psStack_2e8 = (secp256k1_gej *)0x14c18b;
    secp256k1_fe_mul(psStack_2d8,&sStack_2d0.z,&sStack_238.z);
    return;
  }
  psStack_2e8 = (secp256k1_gej *)secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  puVar226 = &psVar235[-1].field_0x97;
  if (psVar235 != (secp256k1_gej *)0x0) {
    lVar241 = (long)puVar226 * 0x68;
    psStack_310 = psVar234;
    uStack_308 = uVar230;
    uStack_300 = uVar225;
    psStack_2f8 = psVar236;
    uStack_2f0 = unaff_R15;
    psStack_2e8 = r;
    secp256k1_ge_verify((secp256k1_ge *)((long)psVar233 + lVar241));
    lVar242 = (long)puVar226 * 0x30;
    secp256k1_fe_verify((secp256k1_fe *)(extraout_RDX_00 + lVar242));
    psVar240 = (secp256k1_fe *)((long)psVar233 + lVar241 + 0x30);
    secp256k1_fe_verify(psVar240);
    uVar231 = *(ulong *)((long)psVar233 + lVar241 + 0x50);
    uVar230 = (uVar231 >> 0x30) * 0x1000003d1 + psVar240->n[0];
    uVar237 = (uVar230 >> 0x34) + *(long *)((long)psVar233 + lVar241 + 0x38);
    uVar225 = (uVar237 >> 0x34) + *(long *)((long)psVar233 + lVar241 + 0x40);
    uVar229 = (uVar225 >> 0x34) + *(long *)((long)psVar233 + lVar241 + 0x48);
    psVar234 = (secp256k1_gej *)(uVar225 & 0xfffffffffffff);
    psVar240->n[0] = uVar230 & 0xfffffffffffff;
    *(ulong *)((long)psVar233 + lVar241 + 0x38) = uVar237 & 0xfffffffffffff;
    *(secp256k1_gej **)((long)psVar233 + lVar241 + 0x40) = psVar234;
    *(ulong *)((long)psVar233 + lVar241 + 0x48) = uVar229 & 0xfffffffffffff;
    *(ulong *)((long)psVar233 + lVar241 + 0x50) = (uVar229 >> 0x34) + (uVar231 & 0xffffffffffff);
    *(undefined4 *)((long)psVar233 + lVar241 + 0x58) = 1;
    secp256k1_fe_verify(psVar240);
    auStack_3b8._0_8_ = *(ulong *)(extraout_RDX_00 + lVar242);
    auStack_3b8._8_8_ = ((ulong *)(extraout_RDX_00 + lVar242))[1];
    puVar2 = (ulong *)(extraout_RDX_00 + 0x10 + lVar242);
    auStack_3b8._16_8_ = *puVar2;
    auStack_3b8._24_8_ = puVar2[1];
    puVar2 = (ulong *)(extraout_RDX_00 + 0x20 + lVar242);
    auStack_3b8._32_8_ = *puVar2;
    auStack_3b8._40_8_ = puVar2[1];
    if (puVar226 != (undefined1 *)0x0) {
      a_01 = (secp256k1_ge *)((long)psVar233 + (long)psVar235 * 0x68 + -0xd0);
      psVar233 = (secp256k1_fe *)(extraout_RDX_00 + (long)psVar235 * 0x30);
      puVar243 = (undefined1 *)0x0;
      do {
        psVar235 = (secp256k1_gej *)auStack_3b8;
        psVar233 = psVar233 + -1;
        secp256k1_fe_verify(psVar233);
        secp256k1_ge_verify(a_01 + 1);
        if (puVar243 != (undefined1 *)0x0) {
          psVar234 = psVar235;
          secp256k1_fe_mul((secp256k1_fe *)psVar235,(secp256k1_fe *)psVar235,psVar233);
        }
        secp256k1_ge_verify(a_01);
        psVar236 = psVar235;
        secp256k1_fe_verify((secp256k1_fe *)psVar235);
        if (a_01->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
LAB_0014c606:
          secp256k1_ge_table_set_globalz_cold_2();
          secp256k1_gej_verify(psVar234);
          if (psVar234->infinity == 0) {
            if (a_00 != (secp256k1_fe *)0x0) {
              uVar218 = (psVar234->y).n[0];
              uVar219 = (psVar234->y).n[1];
              uVar220 = (psVar234->y).n[2];
              uVar221 = (psVar234->y).n[3];
              iVar223 = (psVar234->y).magnitude;
              iVar222 = (psVar234->y).normalized;
              a_00->n[4] = (psVar234->y).n[4];
              a_00->magnitude = iVar223;
              a_00->normalized = iVar222;
              a_00->n[2] = uVar220;
              a_00->n[3] = uVar221;
              a_00->n[0] = uVar218;
              a_00->n[1] = uVar219;
              secp256k1_fe_verify(a_00);
              uVar231 = a_00->n[4];
              uVar230 = (uVar231 >> 0x30) * 0x1000003d1 + a_00->n[0];
              uVar237 = (uVar230 >> 0x34) + a_00->n[1];
              uVar225 = (uVar237 >> 0x34) + a_00->n[2];
              uVar229 = (uVar225 >> 0x34) + a_00->n[3];
              a_00->n[0] = uVar230 & 0xfffffffffffff;
              a_00->n[1] = uVar237 & 0xfffffffffffff;
              a_00->n[2] = uVar225 & 0xfffffffffffff;
              a_00->n[3] = uVar229 & 0xfffffffffffff;
              a_00->n[4] = (uVar229 >> 0x34) + (uVar231 & 0xffffffffffff);
              a_00->magnitude = 1;
              secp256k1_fe_verify(a_00);
            }
            secp256k1_gej_double(psVar236,psVar234);
            secp256k1_gej_verify(psVar236);
            return;
          }
          secp256k1_gej_set_infinity(psVar236);
          if (a_00 != (secp256k1_fe *)0x0) {
            a_00->n[0] = 1;
            a_00->n[1] = 0;
            a_00->n[2] = 0;
            a_00->n[3] = 0;
            a_00->n[4] = 0;
            a_00->magnitude = 1;
            a_00->normalized = 1;
            secp256k1_fe_verify(a_00);
            return;
          }
          return;
        }
        secp256k1_fe_verify((secp256k1_fe *)psVar235);
        psVar236 = psVar235;
        if (8 < (int)auStack_3b8._40_4_) goto LAB_0014c606;
        psVar240 = (secp256k1_fe *)(auStack_3b8 + 0x78);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = auStack_3b8._0_8_ * 2;
        auVar167._8_8_ = 0;
        auVar167._0_8_ = auStack_3b8._24_8_;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = auStack_3b8._8_8_ * 2;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = auStack_3b8._16_8_;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = auStack_3b8._32_8_;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = auStack_3b8._32_8_;
        uVar237 = SUB168(auVar85 * auVar169,0);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar237 & 0xfffffffffffff;
        auVar3 = auVar84 * auVar168 + auVar83 * auVar167 + auVar86 * ZEXT816(0x1000003d10);
        uVar231 = auVar3._0_8_;
        auStack_3b8._72_8_ = uVar231 & 0xfffffffffffff;
        auVar211._8_8_ = 0;
        auVar211._0_8_ = uVar231 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar231 = auStack_3b8._32_8_ * 2;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = auStack_3b8._0_8_;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = uVar231;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = auStack_3b8._8_8_ * 2;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = auStack_3b8._24_8_;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = auStack_3b8._16_8_;
        auVar172._8_8_ = 0;
        auVar172._0_8_ = auStack_3b8._16_8_;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar237 >> 0x34 | SUB168(auVar85 * auVar169,8) << 0xc;
        auVar3 = auVar87 * auVar170 + auVar211 + auVar88 * auVar171 + auVar89 * auVar172 +
                 auVar90 * ZEXT816(0x1000003d10);
        auStack_3b8._64_8_ = auVar3._0_8_;
        auVar212._8_8_ = 0;
        auVar212._0_8_ = (ulong)auStack_3b8._64_8_ >> 0x34 | auVar3._8_8_ << 0xc;
        auStack_3b8._56_8_ = (auStack_3b8._64_8_ & 0xfffffffffffff) >> 0x30;
        auStack_3b8._64_8_ = auStack_3b8._64_8_ & 0xffffffffffff;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = auStack_3b8._0_8_;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = auStack_3b8._0_8_;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = auStack_3b8._8_8_;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = uVar231;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = auStack_3b8._16_8_ * 2;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = auStack_3b8._24_8_;
        auVar3 = auVar92 * auVar174 + auVar212 + auVar93 * auVar175;
        uVar237 = auVar3._0_8_;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = uVar237 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar176._8_8_ = 0;
        auVar176._0_8_ = (uVar237 & 0xfffffffffffff) << 4 | auStack_3b8._56_8_;
        auVar3 = auVar91 * auVar173 + ZEXT816(0x1000003d1) * auVar176;
        uVar237 = auVar3._0_8_;
        auStack_3b8._120_8_ = uVar237 & 0xfffffffffffff;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = uVar237 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = auStack_3b8._0_8_ * 2;
        auVar177._8_8_ = 0;
        auVar177._0_8_ = auStack_3b8._8_8_;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = auStack_3b8._16_8_;
        auVar178._8_8_ = 0;
        auVar178._0_8_ = uVar231;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = auStack_3b8._24_8_;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = auStack_3b8._24_8_;
        auVar4 = auVar95 * auVar178 + auVar214 + auVar96 * auVar179;
        uVar237 = auVar4._0_8_;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar237 & 0xfffffffffffff;
        auVar3 = auVar94 * auVar177 + auVar213 + auVar97 * ZEXT816(0x1000003d10);
        uVar230 = auVar3._0_8_;
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar237 >> 0x34 | auVar4._8_8_ << 0xc;
        uStack_338 = uVar230 & 0xfffffffffffff;
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar230 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = auStack_3b8._0_8_ * 2;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = auStack_3b8._16_8_;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = auStack_3b8._8_8_;
        auVar181._8_8_ = 0;
        auVar181._0_8_ = auStack_3b8._8_8_;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = auStack_3b8._24_8_;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = uVar231;
        auVar216 = auVar100 * auVar182 + auVar216;
        uVar231 = auVar216._0_8_;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar231 & 0xfffffffffffff;
        auVar3 = auVar98 * auVar180 + auVar215 + auVar99 * auVar181 +
                 auVar101 * ZEXT816(0x1000003d10);
        uVar237 = auVar3._0_8_;
        uStack_330 = uVar237 & 0xfffffffffffff;
        auVar217._8_8_ = 0;
        auVar217._0_8_ = (uVar237 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_3b8._72_8_;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar231 >> 0x34 | auVar216._8_8_ << 0xc;
        auVar217 = auVar102 * ZEXT816(0x1000003d10) + auVar217;
        uVar231 = auVar217._0_8_;
        uStack_328 = uVar231 & 0xfffffffffffff;
        lStack_320 = (uVar231 >> 0x34 | auVar217._8_8_ << 0xc) + auStack_3b8._64_8_;
        uStack_318 = 1;
        secp256k1_fe_verify(psVar240);
        secp256k1_fe_mul((secp256k1_fe *)(auStack_3b8 + 0x48),psVar240,(secp256k1_fe *)auStack_3b8);
        secp256k1_fe_mul(&a_01->x,&a_01->x,psVar240);
        psVar234 = (secp256k1_gej *)&a_01->y;
        secp256k1_fe_mul((secp256k1_fe *)psVar234,(secp256k1_fe *)psVar234,
                         (secp256k1_fe *)(auStack_3b8 + 0x48));
        secp256k1_ge_verify(a_01);
        secp256k1_ge_verify(a_01);
        puVar243 = puVar243 + 1;
        a_01 = a_01 + -1;
      } while (puVar226 != puVar243);
    }
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;

    secp256k1_gej_verify(a);
    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */
    secp256k1_gej_verify(r);
}